

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::MemoryCopy::finalize(MemoryCopy *this)

{
  bool bVar1;
  bool local_41;
  Type local_30;
  BasicType local_24 [3];
  Type local_18;
  MemoryCopy *local_10;
  MemoryCopy *this_local;
  
  bVar1 = false;
  if ((this->dest != (Expression *)0x0) && (bVar1 = false, this->source != (Expression *)0x0)) {
    bVar1 = this->size != (Expression *)0x0;
  }
  local_10 = this;
  if (bVar1) {
    wasm::Type::Type(&local_18,none);
    (this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id =
         local_18.id;
    local_24[2] = 1;
    bVar1 = wasm::Type::operator==(&this->dest->type,local_24 + 2);
    local_41 = true;
    if (!bVar1) {
      local_24[1] = 1;
      bVar1 = wasm::Type::operator==(&this->source->type,local_24 + 1);
      local_41 = true;
      if (!bVar1) {
        local_24[0] = unreachable;
        local_41 = wasm::Type::operator==(&this->size->type,local_24);
      }
    }
    if (local_41 != false) {
      wasm::Type::Type(&local_30,unreachable);
      (this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id =
           local_30.id;
    }
    return;
  }
  __assert_fail("dest && source && size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x1b6,"void wasm::MemoryCopy::finalize()");
}

Assistant:

void MemoryCopy::finalize() {
  assert(dest && source && size);
  type = Type::none;
  if (dest->type == Type::unreachable || source->type == Type::unreachable ||
      size->type == Type::unreachable) {
    type = Type::unreachable;
  }
}